

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O2

TRef fold_abc_k(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  IRIns *pIVar4;
  IRIns *pIVar5;
  byte bVar6;
  IRRef1 *pIVar7;
  ulong uVar8;
  
  if ((J->flags & 0x800000) == 0) {
    return 0;
  }
  pIVar7 = J->chain + 10;
  uVar1 = (J->fold).ins.field_0.op1;
  while( true ) {
    if (*pIVar7 <= uVar1) {
      uVar2 = (J->cur).nins;
      uVar8 = (ulong)uVar2;
      if (J->irtoplim <= uVar2) {
        lj_ir_growtop(J);
      }
      (J->cur).nins = uVar2 + 1;
      pIVar4 = (J->cur).ir;
      bVar6 = (J->fold).ins.field_1.o;
      *(IRRef1 *)((long)pIVar4 + uVar8 * 8 + 6) = J->chain[bVar6];
      J->chain[bVar6] = (IRRef1)uVar2;
      *(byte *)((long)pIVar4 + uVar8 * 8 + 5) = bVar6;
      pIVar4[uVar8].field_0.op1 = (J->fold).ins.field_0.op1;
      *(IRRef1 *)((long)pIVar4 + uVar8 * 8 + 2) = (J->fold).ins.field_0.op2;
      iVar3 = *(int *)((long)&(J->fold).ins + 4);
      bVar6 = (byte)iVar3;
      (J->guardemit).irt = (J->guardemit).irt | bVar6;
      *(byte *)((long)pIVar4 + uVar8 * 8 + 4) = bVar6;
      return iVar3 * 0x1000000 + uVar2;
    }
    pIVar5 = (J->cur).ir;
    pIVar4 = pIVar5 + *pIVar7;
    if (((pIVar4->field_0).op1 == uVar1) && (-1 < (long)(short)(pIVar4->field_0).op2)) break;
    pIVar7 = &(pIVar4->field_0).prev;
  }
  if (pIVar5[(short)(pIVar4->field_0).op2].i < (J->fold).right[0].i) {
    (pIVar4->field_0).op2 = (J->fold).ins.field_0.op2;
  }
  return 4;
}

Assistant:

LJFOLD(ABC any KINT)
LJFOLDF(abc_k)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    IRRef ref = J->chain[IR_ABC];
    IRRef asize = fins->op1;
    while (ref > asize) {
      IRIns *ir = IR(ref);
      if (ir->op1 == asize && irref_isk(ir->op2)) {
	int32_t k = IR(ir->op2)->i;
	if (fright->i > k)
	  ir->op2 = fins->op2;
	return DROPFOLD;
      }
      ref = ir->prev;
    }
    return EMITFOLD;  /* Already performed CSE. */
  }
  return NEXTFOLD;
}